

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::AssignmentExpression::fromSyntax
          (Compilation *compilation,BinaryExpressionSyntax *syntax,ASTContext *context)

{
  SyntaxKind kind;
  TimingControlSyntax *pTVar1;
  Type *pTVar2;
  ExpressionSyntax *syntax_00;
  undefined8 uVar3;
  bool bVar4;
  BinaryOperator BVar5;
  ulong uVar6;
  Expression *pEVar7;
  TimingControlExpressionSyntax *pTVar8;
  SourceLocation assignLoc;
  AssignmentPatternExpressionSyntax *pAVar9;
  Type *pTVar10;
  Expression *this;
  SourceLocation rhs;
  bitmask<slang::ast::AssignFlags> flags;
  bitmask<slang::ast::ASTFlags> extraFlags;
  char *func;
  socklen_t __len;
  optional<slang::ast::BinaryOperator> op;
  uint uVar11;
  DiagCode code;
  SyntaxNode *this_00;
  SyntaxNode *this_01;
  SourceRange SVar12;
  Expression *lhs;
  ASTContext *in_stack_ffffffffffffff48;
  ulong local_a0;
  SourceLocation local_88;
  SourceLocation SStack_80;
  SourceLocation local_78;
  SourceLocation SStack_70;
  sockaddr local_68;
  ulong local_58;
  Symbol *pSStack_50;
  TempVarSymbol *local_48;
  RandomizeDetails *pRStack_40;
  AssertionInstanceDetails *local_38;
  undefined4 extraout_var;
  
  kind = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  uVar11 = 0;
  uVar6 = (context->flags).m_bits;
  if ((kind == NonblockingAssignmentExpression) && (uVar11 = 1, ((uint)uVar6 >> 0xe & 1) != 0)) {
    SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0x9c;
LAB_003a5e03:
    ASTContext::addDiag(context,code,SVar12);
    pEVar7 = Expression::badExpr(compilation,(Expression *)0x0);
    return pEVar7;
  }
  if ((uVar6 & 0x20) == 0) {
    SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0xb;
    if ((uVar6 & 0xc0) == 0) {
      code.subsystem = Expressions;
      code.code = 0x16;
    }
    goto LAB_003a5e03;
  }
  extraFlags.m_bits = 0x200;
  uVar6 = 0;
  if (kind == AssignmentExpression) {
    local_a0 = 0;
  }
  else {
    local_a0 = 0;
    if (kind != NonblockingAssignmentExpression) {
      BVar5 = Expression::getBinaryOperator(kind);
      uVar6 = (ulong)BVar5;
      local_a0 = 0x100000000;
      extraFlags.m_bits = 0;
    }
  }
  this_01 = &((syntax->right).ptr)->super_SyntaxNode;
  if (this_01 != (SyntaxNode *)0x0) {
    if ((((context->flags).m_bits & 0x400) == 0) || (this_01->kind != TimingControlExpression)) {
      assignLoc = (SourceLocation)0x0;
    }
    else {
      local_68._0_8_ = (context->scope).ptr;
      local_68.sa_data._6_8_ = *(undefined8 *)&context->lookupIndex;
      pSStack_50 = context->instanceOrProc;
      local_48 = context->firstTempVar;
      pRStack_40 = context->randomizeDetails;
      local_38 = context->assertionInstance;
      local_58 = (ulong)(kind == NonblockingAssignmentExpression) << 0xf | (context->flags).m_bits |
                 0x400000;
      pTVar8 = slang::syntax::SyntaxNode::as<slang::syntax::TimingControlExpressionSyntax>(this_01);
      pTVar1 = (pTVar8->timing).ptr;
      if (pTVar1 == (TimingControlSyntax *)0x0) {
        func = 
        "T slang::not_null<slang::syntax::TimingControlSyntax *>::get() const [T = slang::syntax::TimingControlSyntax *]"
        ;
        goto LAB_003a6147;
      }
      assignLoc._0_4_ = TimingControl::bind((int)pTVar1,&local_68,__len);
      assignLoc._4_4_ = extraout_var;
      this_01 = &((pTVar8->expr).ptr)->super_SyntaxNode;
      if (this_01 == (SyntaxNode *)0x0) goto LAB_003a611b;
    }
    this_00 = &((syntax->left).ptr)->super_SyntaxNode;
    if (this_00 != (SyntaxNode *)0x0) {
      if ((this_00->kind != AssignmentPatternExpression) ||
         (this_01->kind == StreamingConcatenationExpression)) {
LAB_003a5f34:
        pEVar7 = Expression::selfDetermined
                           (compilation,(ExpressionSyntax *)this_00,context,
                            (bitmask<slang::ast::ASTFlags>)(extraFlags.m_bits + 0x400000));
        pTVar2 = (pEVar7->type).ptr;
        if (pTVar2 != (Type *)0x0) {
          pTVar10 = pTVar2->canonical;
          if (pTVar10 == (Type *)0x0) {
            Type::resolveCanonical(pTVar2);
            pTVar10 = pTVar2->canonical;
          }
          if ((pTVar10->super_Symbol).kind == VirtualInterfaceType) {
            pTVar2 = (pEVar7->type).ptr;
            if (pTVar2 == (Type *)0x0) goto LAB_003a6132;
            this = Expression::tryBindInterfaceRef(context,(ExpressionSyntax *)this_01,pTVar2);
            if (this == (Expression *)0x0) goto LAB_003a5f96;
          }
          else {
LAB_003a5f96:
            if ((pEVar7->kind == Streaming) && (this_01->kind != StreamingConcatenationExpression))
            {
              this = Expression::selfDetermined
                               (compilation,(ExpressionSyntax *)this_01,context,extraFlags);
            }
            else {
              pTVar2 = (pEVar7->type).ptr;
              if (pTVar2 == (Type *)0x0) goto LAB_003a6132;
              this = Expression::create(compilation,(ExpressionSyntax *)this_01,context,extraFlags,
                                        pTVar2);
            }
          }
          rhs = parsing::Token::location(&syntax->operatorToken);
          SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          local_88 = SVar12.startLoc;
          SStack_80 = SVar12.endLoc;
          flags.m_bits = (underlying_type)pEVar7;
LAB_003a6035:
          op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::BinaryOperator>._4_4_ = 0;
          op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload._M_value = uVar11;
          SVar12.endLoc = (SourceLocation)context;
          SVar12.startLoc = SStack_80;
          pEVar7 = fromComponents((AssignmentExpression *)compilation,
                                  (Compilation *)(local_a0 | uVar6),op,flags,this,(Expression *)rhs,
                                  assignLoc,(TimingControl *)local_88,SVar12,
                                  in_stack_ffffffffffffff48);
          return pEVar7;
        }
LAB_003a6132:
        func = 
        "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
        goto LAB_003a6147;
      }
      pAVar9 = slang::syntax::SyntaxNode::as<slang::syntax::AssignmentPatternExpressionSyntax>
                         (this_00);
      if (pAVar9->type == (DataTypeSyntax *)0x0) {
        this = Expression::selfDetermined
                         (compilation,(ExpressionSyntax *)this_01,context,
                          (bitmask<slang::ast::ASTFlags>)0x0);
        bVar4 = Expression::bad(this);
        if (bVar4) {
          pEVar7 = Expression::badExpr(compilation,this);
          return pEVar7;
        }
        syntax_00 = (syntax->left).ptr;
        if (syntax_00 != (ExpressionSyntax *)0x0) {
          pTVar2 = (this->type).ptr;
          if (pTVar2 != (Type *)0x0) {
            local_68._0_8_ =
                 Expression::create(compilation,syntax_00,context,
                                    (bitmask<slang::ast::ASTFlags>)0x400000,pTVar2);
            Expression::selfDetermined(context,(Expression **)&local_68);
            uVar3 = local_68._0_8_;
            rhs = parsing::Token::location(&syntax->operatorToken);
            SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            local_78 = SVar12.startLoc;
            SStack_70 = SVar12.endLoc;
            flags.m_bits = (underlying_type)uVar3;
            local_88 = local_78;
            SStack_80 = SStack_70;
            goto LAB_003a6035;
          }
          goto LAB_003a6132;
        }
      }
      else {
        this_00 = &((syntax->left).ptr)->super_SyntaxNode;
        if (this_00 != (SyntaxNode *)0x0) goto LAB_003a5f34;
      }
    }
  }
LAB_003a611b:
  func = 
  "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
  ;
LAB_003a6147:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& AssignmentExpression::fromSyntax(Compilation& compilation,
                                             const BinaryExpressionSyntax& syntax,
                                             const ASTContext& context) {
    bitmask<AssignFlags> assignFlags;
    bool isNonBlocking = syntax.kind == SyntaxKind::NonblockingAssignmentExpression;
    if (isNonBlocking)
        assignFlags = AssignFlags::NonBlocking;

    if (isNonBlocking && context.flags.has(ASTFlags::Final)) {
        context.addDiag(diag::NonblockingInFinal, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (!context.flags.has(ASTFlags::AssignmentAllowed)) {
        if (!context.flags.has(ASTFlags::NonProcedural) &&
            !context.flags.has(ASTFlags::AssignmentDisallowed)) {
            context.addDiag(diag::AssignmentRequiresParens, syntax.sourceRange());
        }
        else {
            context.addDiag(diag::AssignmentNotAllowed, syntax.sourceRange());
        }
        return badExpr(compilation, nullptr);
    }

    bitmask<ASTFlags> extraFlags = ASTFlags::None;
    std::optional<BinaryOperator> op;
    if (syntax.kind != SyntaxKind::AssignmentExpression &&
        syntax.kind != SyntaxKind::NonblockingAssignmentExpression) {
        op = getBinaryOperator(syntax.kind);
    }
    else {
        extraFlags |= ASTFlags::StreamingAllowed;
    }

    const ExpressionSyntax* rightExpr = syntax.right;

    // If we're in a top-level statement, check for an intra-assignment timing control.
    // Otherwise, we'll let this fall through to the default handler which will issue an error.
    const TimingControl* timingControl = nullptr;
    if (context.flags.has(ASTFlags::TopLevelStatement) &&
        rightExpr->kind == SyntaxKind::TimingControlExpression) {

        ASTContext timingCtx = context;
        timingCtx.flags |= ASTFlags::LValue;
        if (isNonBlocking)
            timingCtx.flags |= ASTFlags::NonBlockingTimingControl;

        auto& tce = rightExpr->as<TimingControlExpressionSyntax>();
        timingControl = &TimingControl::bind(*tce.timing, timingCtx);
        rightExpr = tce.expr;
    }

    // The right hand side of an assignment expression is typically an
    // "assignment-like context", except if the left hand side does not
    // have a self-determined type. That can only be true if the lhs is
    // an assignment pattern without an explicit type.
    // However, streaming concatenation has no explicit type either so it is excluded and such right
    // hand side will lead to diag::AssignmentPatternNoContext error later.
    if (syntax.left->kind == SyntaxKind::AssignmentPatternExpression &&
        rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
        auto& pattern = syntax.left->as<AssignmentPatternExpressionSyntax>();
        if (!pattern.type) {
            // In this case we have to bind the rhs first to determine the
            // correct type to use as the context for the lhs.
            Expression* rhs = &selfDetermined(compilation, *rightExpr, context);
            if (rhs->bad())
                return badExpr(compilation, rhs);

            auto lhs = &create(compilation, *syntax.left, context, ASTFlags::LValue, rhs->type);
            selfDetermined(context, lhs);

            return fromComponents(compilation, op, assignFlags, *lhs, *rhs,
                                  syntax.operatorToken.location(), timingControl,
                                  syntax.sourceRange(), context);
        }
    }

    auto& lhs = selfDetermined(compilation, *syntax.left, context, extraFlags | ASTFlags::LValue);

    Expression* rhs = nullptr;
    if (lhs.type->isVirtualInterface())
        rhs = tryBindInterfaceRef(context, *rightExpr, *lhs.type);

    if (!rhs) {
        // When LHS is a streaming concatenation which has no explicit type, RHS should be
        // self-determined and we cannot pass lsh.type to it. When both LHS and RHS are streaming
        // concatenations, pass lhs.type to notify RHS to exclude associative arrays for
        // isBitstreamType check, while RHS can still be self-determined by ignoring lhs type
        // information.
        if (lhs.kind == ExpressionKind::Streaming &&
            rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
            rhs = &selfDetermined(compilation, *rightExpr, context, extraFlags);
        }
        else {
            rhs = &create(compilation, *rightExpr, context, extraFlags, lhs.type);
        }
    }

    return fromComponents(compilation, op, assignFlags, lhs, *rhs, syntax.operatorToken.location(),
                          timingControl, syntax.sourceRange(), context);
}